

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_parser.tab.hh
# Opt level: O3

void __thiscall
MC::MC_Parser::basic_symbol<MC::MC_Parser::by_state>::clear
          (basic_symbol<MC::MC_Parser::by_state> *this)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = (ulong)(this->super_by_state).state;
  if (uVar1 == 0) goto switchD_001489fd_caseD_13;
  uVar2 = *(ushort *)(yystos_ + uVar1 * 2) - 0x102;
  if ((uVar2 < 0x1d) && ((0x1790498bU >> (uVar2 & 0x1f) & 1) != 0)) {
switchD_001489fd_caseD_14:
    value_type::as<int>(&this->value);
    goto LAB_001489dd;
  }
  switch(*(ushort *)(yystos_ + uVar1 * 2)) {
  case 0x12:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x1b:
    value_type::destroy<std::__cxx11::string>(&this->value);
  default:
    goto switchD_001489fd_caseD_13;
  case 0x14:
  case 0x18:
    goto switchD_001489fd_caseD_14;
  case 0x19:
    value_type::as<bool>(&this->value);
    break;
  case 0x1a:
    value_type::as<float>(&this->value);
  }
LAB_001489dd:
  (this->value).yytypeid_ = (type_info *)0x0;
switchD_001489fd_caseD_13:
  (this->super_by_state).state = '\0';
  return;
}

Assistant:

void clear () YY_NOEXCEPT
      {
        // User destructor.
        symbol_kind_type yykind = this->kind ();
        basic_symbol<Base>& yysym = *this;
        (void) yysym;
        switch (yykind)
        {
       default:
          break;
        }

        // Value type destructor.
switch (yykind)
    {
      case symbol_kind::S_BOOL: // BOOL
        value.template destroy< bool > ();
        break;

      case symbol_kind::S_APPROXNUM: // APPROXNUM
        value.template destroy< float > ();
        break;

      case symbol_kind::S_COMPARISON: // COMPARISON
      case symbol_kind::S_INTNUM: // INTNUM
      case symbol_kind::S_column_list: // column_list
      case symbol_kind::S_select_expr_list: // select_expr_list
      case symbol_kind::S_table_references: // table_references
      case symbol_kind::S_delete_opts: // delete_opts
      case symbol_kind::S_delete_list: // delete_list
      case symbol_kind::S_insert_opts: // insert_opts
      case symbol_kind::S_insert_vals_list: // insert_vals_list
      case symbol_kind::S_create_col_list: // create_col_list
      case symbol_kind::S_column_atts: // column_atts
      case symbol_kind::S_opt_length: // opt_length
      case symbol_kind::S_opt_binary: // opt_binary
      case symbol_kind::S_opt_uz: // opt_uz
      case symbol_kind::S_data_type: // data_type
        value.template destroy< int > ();
        break;

      case symbol_kind::S_WORD: // WORD
      case symbol_kind::S_HLH: // HLH
      case symbol_kind::S_NAME: // NAME
      case symbol_kind::S_STRING: // STRING
      case symbol_kind::S_USERVAR: // USERVAR
        value.template destroy< std::string > ();
        break;

      default:
        break;
    }

        Base::clear ();
      }